

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void iterator_suite::run(void)

{
  test_empty();
  test_iterator();
  test_iterator_constructible();
  test_const_iterator();
  test_const_iterator_constructible();
  test_push_front();
  test_push_back();
  test_push_alternating();
  return;
}

Assistant:

void run()
{
    test_empty();
    test_iterator();
    test_iterator_constructible();
    test_const_iterator();
    test_const_iterator_constructible();
    test_push_front();
    test_push_back();
    test_push_alternating();
}